

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BVHLoader.cpp
# Opt level: O0

void __thiscall Assimp::BVHLoader::BVHLoader(BVHLoader *this)

{
  BVHLoader *this_local;
  
  BaseImporter::BaseImporter(&this->super_BaseImporter);
  (this->super_BaseImporter)._vptr_BaseImporter = (_func_int **)&PTR_UpdateImporterScale_00dfe368;
  std::__cxx11::string::string((string *)&this->mFileName);
  std::vector<char,_std::allocator<char>_>::vector(&this->mBuffer);
  __gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>::
  __normal_iterator(&this->mReader);
  this->mLine = 0;
  std::vector<Assimp::BVHLoader::Node,_std::allocator<Assimp::BVHLoader::Node>_>::vector
            (&this->mNodes);
  this->mAnimTickDuration = 0.0;
  this->mAnimNumFrames = 0;
  this->noSkeletonMesh = false;
  return;
}

Assistant:

BVHLoader::BVHLoader()
    : mLine(),
    mAnimTickDuration(),
    mAnimNumFrames(),
    noSkeletonMesh()
{}